

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O1

void __thiscall
uWS::WebSocketHandshake::static_for<18,_uWS::WebSocketHandshake::Sha1Loop<4>_>::operator()
          (static_for<18,_uWS::WebSocketHandshake::Sha1Loop<4>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  static_for<17,_uWS::WebSocketHandshake::Sha1Loop<4>_> local_11;
  
  static_for<17,_uWS::WebSocketHandshake::Sha1Loop<4>_>::operator()(&local_11,a,b);
  uVar1 = b[1] ^ b[6] ^ b[0xb] ^ b[9];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[9] = uVar2;
  uVar1 = *a;
  a[2] = a[2] + (a[1] << 5 | a[1] >> 0x1b) + uVar2 + (a[4] & uVar1 | (a[4] | uVar1) & a[3]) +
         0x8f1bbcdc;
  *a = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }